

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void * AllocUnits(CPpmd7 *p,uint indx)

{
  byte bVar1;
  uint uVar2;
  void *retVal;
  long lVar3;
  uint oldIndx;
  uint uVar4;
  ulong uVar5;
  Byte *pBVar6;
  Byte *pBVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar5 = (ulong)p->FreeList[indx];
  if (uVar5 != 0) {
    pBVar6 = p->Base;
    p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar6 + uVar5);
    return pBVar6 + uVar5;
  }
  lVar3 = (ulong)p->Indx2Units[indx] * 0xc;
  pBVar6 = p->LoUnit;
  if ((uint)(*(int *)&p->HiUnit - (int)pBVar6) < (uint)lVar3) {
    oldIndx = indx;
    if (p->GlueCount == 0) {
      uVar4 = p->Size + p->AlignOffset;
      p->GlueCount = 0xff;
      uVar8 = uVar4;
      for (lVar3 = 0; lVar3 != 0x26; lVar3 = lVar3 + 1) {
        bVar1 = p->Indx2Units[lVar3];
        uVar2 = p->FreeList[lVar3];
        p->FreeList[lVar3] = 0;
        while (uVar2 != 0) {
          pBVar6 = p->Base;
          *(uint *)(pBVar6 + (ulong)uVar2 + 4) = uVar8;
          *(uint *)(pBVar6 + (ulong)uVar8 + 8) = uVar2;
          uVar12 = *(uint *)(pBVar6 + uVar2);
          (pBVar6 + uVar2)[0] = '\0';
          (pBVar6 + uVar2)[1] = '\0';
          *(ushort *)(pBVar6 + (ulong)uVar2 + 2) = (ushort)bVar1;
          uVar8 = uVar2;
          uVar2 = uVar12;
        }
      }
      pBVar6 = p->Base;
      (pBVar6 + uVar4)[0] = '\x01';
      (pBVar6 + uVar4)[1] = '\0';
      *(uint *)(pBVar6 + (ulong)uVar4 + 4) = uVar8;
      *(uint *)(pBVar6 + (ulong)uVar8 + 8) = uVar4;
      pBVar7 = p->LoUnit;
      if (pBVar7 != p->HiUnit) {
        pBVar7[0] = '\x01';
        pBVar7[1] = '\0';
      }
      while (uVar8 != uVar4) {
        uVar5 = (ulong)uVar8;
        uVar8 = (uint)*(ushort *)(pBVar6 + uVar5 + 2);
        while ((lVar3 = (ulong)uVar8 * 0xc, *(short *)(pBVar6 + lVar3 + uVar5) == 0 &&
               (uVar8 = uVar8 + *(ushort *)(pBVar6 + lVar3 + uVar5 + 2), uVar8 < 0x10000))) {
          uVar2 = *(uint *)(pBVar6 + lVar3 + uVar5 + 4);
          uVar12 = *(uint *)(pBVar6 + lVar3 + uVar5 + 8);
          *(uint *)(pBVar6 + (ulong)uVar12 + 4) = uVar2;
          *(uint *)(pBVar6 + (ulong)uVar2 + 8) = uVar12;
          *(short *)(pBVar6 + uVar5 + 2) = (short)uVar8;
        }
        uVar8 = *(uint *)(pBVar6 + uVar5 + 4);
      }
      uVar8 = *(uint *)(pBVar6 + (ulong)uVar4 + 4);
      while (uVar8 != uVar4) {
        uVar5 = (ulong)uVar8;
        uVar2 = *(uint *)(pBVar6 + uVar5 + 4);
        uVar11 = (ulong)(*(ushort *)(pBVar6 + uVar5 + 2) - 1);
        iVar9 = 0;
        pBVar7 = pBVar6;
        for (uVar12 = (uint)*(ushort *)(pBVar6 + uVar5 + 2); 0x80 < uVar12; uVar12 = uVar12 - 0x80)
        {
          *(CPpmd_Void_Ref *)(pBVar7 + uVar5) = p->FreeList[0x25];
          p->FreeList[0x25] = uVar8 + iVar9;
          iVar9 = iVar9 + 0x600;
          pBVar7 = pBVar7 + 0x600;
          uVar11 = uVar11 - 0x80;
        }
        uVar10 = (ulong)p->Units2Indx[uVar11];
        if (p->Indx2Units[uVar10] != uVar12) {
          uVar10 = (ulong)(p->Units2Indx[uVar11] - 1);
          lVar3 = (ulong)p->Indx2Units[uVar10] * 0xc + uVar5;
          uVar12 = (int)uVar11 - (uint)p->Indx2Units[uVar10];
          *(CPpmd_Void_Ref *)(pBVar7 + lVar3) = p->FreeList[uVar12];
          p->FreeList[uVar12] = iVar9 + (int)lVar3;
        }
        *(CPpmd_Void_Ref *)(pBVar7 + uVar5) = p->FreeList[uVar10];
        p->FreeList[uVar10] = uVar8 + iVar9;
        uVar8 = uVar2;
      }
      uVar5 = (ulong)p->FreeList[indx];
      if (uVar5 != 0) {
        p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar6 + uVar5);
        return pBVar6 + uVar5;
      }
    }
    do {
      if (oldIndx == 0x25) {
        bVar1 = p->Indx2Units[indx];
        p->GlueCount = p->GlueCount - 1;
        if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
          pBVar6 = p->UnitsStart + (ulong)bVar1 * -0xc;
          p->UnitsStart = pBVar6;
          return pBVar6;
        }
        return (void *)0x0;
      }
      oldIndx = oldIndx + 1;
      uVar5 = (ulong)p->FreeList[oldIndx];
    } while (uVar5 == 0);
    pBVar6 = p->Base + uVar5;
    p->FreeList[oldIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar5);
    SplitBlock(p,pBVar6,oldIndx,indx);
    return pBVar6;
  }
  p->LoUnit = pBVar6 + lVar3;
  return pBVar6;
}

Assistant:

static void *AllocUnits(CPpmd7 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}